

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tokenizer.cc
# Opt level: O2

bool google::protobuf::io::ReadHexDigits(char *ptr,int len,uint32 *result)

{
  int iVar1;
  uint32 uVar2;
  char *pcVar3;
  bool bVar4;
  
  *result = 0;
  uVar2 = 0;
  if (len == 0) {
    bVar4 = false;
  }
  else {
    pcVar3 = ptr + len;
    for (; (bVar4 = pcVar3 <= ptr, !bVar4 && (*ptr != '\0')); ptr = ptr + 1) {
      iVar1 = anon_unknown_4::DigitValue(*ptr);
      uVar2 = uVar2 * 0x10 + iVar1;
      *result = uVar2;
    }
  }
  return bVar4;
}

Assistant:

static bool ReadHexDigits(const char* ptr, int len, uint32* result) {
  *result = 0;
  if (len == 0) return false;
  for (const char* end = ptr + len; ptr < end; ++ptr) {
    if (*ptr == '\0') return false;
    *result = (*result << 4) + DigitValue(*ptr);
  }
  return true;
}